

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.cpp
# Opt level: O0

void __thiscall
QMetaCallEvent::QMetaCallEvent
          (QMetaCallEvent *this,QSlotObjectBase *slotO,QObject *sender,int signalId,void **args,
          QSemaphore *semaphore)

{
  bool bVar1;
  undefined4 in_ECX;
  pointer in_RDI;
  QObject *in_R8;
  unique_ptr<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter> *in_R9;
  undefined4 in_stack_ffffffffffffffe0;
  
  QAbstractMetaCallEvent::QAbstractMetaCallEvent
            ((QAbstractMetaCallEvent *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),in_R8,
             (int)((ulong)in_R9 >> 0x20),(QSemaphore *)in_RDI);
  *(undefined ***)in_RDI = &PTR__QMetaCallEvent_00be7348;
  std::unique_ptr<QtPrivate::QSlotObjectBase,QtPrivate::QSlotObjectBase::Deleter>::
  unique_ptr<QtPrivate::QSlotObjectBase::Deleter,void>(in_R9,in_RDI);
  *(QObject **)(in_RDI + 3) = in_R8;
  in_RDI[3].m_impl = (ImplFn)0x0;
  in_RDI[4].m_ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i = 0;
  *(undefined2 *)&in_RDI[4].field_0x4 = 0;
  *(undefined2 *)&in_RDI[4].field_0x6 = 0xffff;
  memset(&in_RDI[4].m_impl,0,0x30);
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter> *)
                     0x3eb7b6);
  if (bVar1) {
    std::unique_ptr<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter>::operator->
              ((unique_ptr<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter> *)
               0x3eb7c9);
    QtPrivate::QSlotObjectBase::ref((QSlotObjectBase *)0x3eb7d1);
  }
  return;
}

Assistant:

QMetaCallEvent::QMetaCallEvent(QtPrivate::QSlotObjectBase *slotO,
                               const QObject *sender, int signalId,
                               void **args, QSemaphore *semaphore)
    : QAbstractMetaCallEvent(sender, signalId, semaphore),
      d({QtPrivate::SlotObjUniquePtr{slotO}, args, nullptr, 0, 0, ushort(-1)}),
      prealloc_()
{
    if (d.slotObj_)
        d.slotObj_->ref();
}